

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execution_environment_common.cpp
# Opt level: O0

LCC_API_CLOUD_PROVIDER __thiscall
license::os::ExecutionEnvironment::cloud_provider(ExecutionEnvironment *this)

{
  string *psVar1;
  long lVar2;
  string local_88 [8];
  string sys_vendor;
  string local_58 [8];
  string bios_vendor;
  string bios_description;
  LCC_API_CLOUD_PROVIDER result;
  ExecutionEnvironment *this_local;
  
  bios_description.field_2._12_4_ = 0;
  psVar1 = DmiInfo::bios_description_abi_cxx11_(&this->m_dmi_info);
  std::__cxx11::string::string((string *)(bios_vendor.field_2._M_local_buf + 8),(string *)psVar1);
  psVar1 = DmiInfo::bios_vendor_abi_cxx11_(&this->m_dmi_info);
  std::__cxx11::string::string(local_58,(string *)psVar1);
  psVar1 = DmiInfo::sys_vendor_abi_cxx11_(&this->m_dmi_info);
  std::__cxx11::string::string(local_88,(string *)psVar1);
  lVar2 = std::__cxx11::string::size();
  if (((lVar2 != 0) || (lVar2 = std::__cxx11::string::size(), lVar2 != 0)) ||
     (lVar2 = std::__cxx11::string::size(), lVar2 != 0)) {
    lVar2 = std::__cxx11::string::find((char *)local_58,0x47b07b);
    if (((lVar2 == -1) &&
        (lVar2 = std::__cxx11::string::find(bios_vendor.field_2._M_local_buf + 8,0x47b083),
        lVar2 == -1)) &&
       (lVar2 = std::__cxx11::string::find((char *)local_88,0x47b083), lVar2 == -1)) {
      lVar2 = std::__cxx11::string::find((char *)local_88,0x47b08b);
      if ((lVar2 == -1) &&
         (lVar2 = std::__cxx11::string::find(bios_vendor.field_2._M_local_buf + 8,0x47b092),
         lVar2 == -1)) {
        lVar2 = std::__cxx11::string::find((char *)local_58,0x47b0a6);
        if (((lVar2 == -1) &&
            (lVar2 = std::__cxx11::string::find(bios_vendor.field_2._M_local_buf + 8,0x47b0aa),
            lVar2 == -1)) &&
           (lVar2 = std::__cxx11::string::find((char *)local_88,0x47b0a6), lVar2 == -1)) {
          lVar2 = std::__cxx11::string::find(bios_vendor.field_2._M_local_buf + 8,0x47b0b1);
          if (((lVar2 != -1) ||
              (lVar2 = std::__cxx11::string::find(bios_vendor.field_2._M_local_buf + 8,0x47b0bb),
              lVar2 != -1)) ||
             (lVar2 = std::__cxx11::string::find(bios_vendor.field_2._M_local_buf + 8,0x47b0c0),
             lVar2 != -1)) {
            bios_description.field_2._12_4_ = 1;
          }
        }
        else {
          bios_description.field_2._12_4_ = 4;
        }
      }
      else {
        bios_description.field_2._12_4_ = 2;
      }
    }
    else {
      bios_description.field_2._12_4_ = 5;
    }
  }
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string((string *)(bios_vendor.field_2._M_local_buf + 8));
  return bios_description.field_2._12_4_;
}

Assistant:

LCC_API_CLOUD_PROVIDER ExecutionEnvironment::cloud_provider() const {
	LCC_API_CLOUD_PROVIDER result = PROV_UNKNOWN;
	const string bios_description = m_dmi_info.bios_description();
	const string bios_vendor = m_dmi_info.bios_vendor();
	const string sys_vendor = m_dmi_info.sys_vendor();
	if (bios_description.size() > 0 || bios_vendor.size() > 0 || sys_vendor.size() > 0) {
		if (bios_vendor.find("SEABIOS") != string::npos || bios_description.find("ALIBABA") != string::npos ||
			sys_vendor.find("ALIBABA") != string::npos) {
			result = ALI_CLOUD;
		} else if (sys_vendor.find("GOOGLE") != string::npos ||
				   bios_description.find("GOOGLECOMPUTEENGINE") != string::npos) {
			result = GOOGLE_CLOUD;
		} else if (bios_vendor.find("AWS") != string::npos || bios_description.find("AMAZON") != string::npos ||
				   sys_vendor.find("AWS") != string::npos) {
			result = AWS;
		} else if (bios_description.find("HP-COMPAQ") != string::npos ||
				   bios_description.find("ASUS") != string::npos || bios_description.find("DELL") != string::npos) {
			result = ON_PREMISE;
		}
	}
	return result;
}